

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

string * __thiscall
llvm::APInt::toString_abi_cxx11_(string *__return_storage_ptr__,APInt *this,uint Radix,bool Signed)

{
  StringRef local_68;
  undefined1 local_58 [8];
  SmallString<40U> S;
  bool Signed_local;
  uint Radix_local;
  APInt *this_local;
  
  S.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.InlineElts[0x23].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] =
       (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)Signed;
  S.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.InlineElts._36_4_ = Radix;
  SmallString<40U>::SmallString((SmallString<40U> *)local_58);
  toString(this,(SmallVectorImpl<char> *)local_58,
           S.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.InlineElts._36_4_,
           (bool)((byte)S.super_SmallVector<char,_40U>.super_SmallVectorStorage<char,_40U>.
                        InlineElts[0x23].super_AlignedCharArray<1UL,_1UL>.buffer[0] & 1),false);
  local_68 = SmallString<40U>::str((SmallString<40U> *)local_58);
  StringRef::operator_cast_to_string(__return_storage_ptr__,&local_68);
  SmallString<40U>::~SmallString((SmallString<40U> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string APInt::toString(unsigned Radix = 10, bool Signed = true) const {
  SmallString<40> S;
  toString(S, Radix, Signed, /* formatAsCLiteral = */false);
  return S.str();
}